

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O1

void __thiscall QtConcurrent::ThreadEngineBase::run(ThreadEngineBase *this)

{
  long lVar1;
  QFutureInterfaceBase *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ulong in_RCX;
  uint uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->futureInterface != (QFutureInterfaceBase *)0x0) &&
     (cVar3 = QFutureInterfaceBase::isCanceled(), cVar3 != '\0')) {
LAB_00102ce3:
    pQVar2 = this->futureInterface;
    iVar5 = ThreadEngineBarrier::release(&this->barrier);
    if ((iVar5 == 0) && (pQVar2 != (QFutureInterfaceBase *)0x0)) {
      (**(code **)(*(long *)this + 0x40))(this);
    }
LAB_00102d02:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return;
  }
  do {
    cVar3 = (**(code **)(*(long *)this + 0x30))(this);
    if (cVar3 == '\0') break;
    bVar4 = startThreadInternal(this);
  } while (bVar4);
  do {
    iVar5 = (**(code **)(*(long *)this + 0x28))(this);
    if (iVar5 != 0) goto LAB_00102ce3;
    do {
      iVar5 = (this->barrier).count.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
              _q_value.super___atomic_base<int>._M_i;
      uVar6 = iVar5 + 1;
      if ((uVar6 & 0xfffffffd) == 0) {
        in_RCX = 0;
        bVar4 = false;
      }
      else {
        if (-1 < iVar5) {
          uVar6 = iVar5 - 1;
        }
        LOCK();
        bVar4 = iVar5 == (this->barrier).count.super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i;
        if (bVar4) {
          (this->barrier).count.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i = uVar6;
        }
        UNLOCK();
        if (bVar4) {
          bVar4 = false;
          in_RCX = 1;
        }
        else {
          bVar4 = true;
        }
      }
    } while (bVar4);
    if ((in_RCX & 1) != 0) goto LAB_00102d02;
    reportIfSuspensionDone(this);
  } while( true );
}

Assistant:

void ThreadEngineBase::run() // implements QRunnable.
{
    if (this->isCanceled()) {
        threadExit();
        return;
    }

    startThreads();

#ifndef QT_NO_EXCEPTIONS
    try {
#endif
        while (threadFunction() == ThrottleThread) {
            // threadFunction returning ThrottleThread means it that the user
            // struct wants to be throttled by making a worker thread exit.
            // Respect that request unless this is the only worker thread left
            // running, in which case it has to keep going.
            if (threadThrottleExit()) {
                return;
            } else {
                // If the last worker thread is throttled and the state is "suspending",
                // it means that suspension has been requested, and it is already
                // in effect (because all previous threads have already exited).
                // Report the "Suspended" state.
                reportIfSuspensionDone();
            }
        }

#ifndef QT_NO_EXCEPTIONS
    } catch (QException &e) {
        handleException(e);
    } catch (...) {
        handleException(QUnhandledException(std::current_exception()));
    }
#endif
    threadExit();
}